

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O1

char * get_param_word(char **str,char **end_pos,char endchar)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  
  pcVar5 = *str;
  pcVar2 = pcVar5;
  if (*pcVar5 == '\"') {
    pcVar4 = pcVar5 + 1;
    pcVar3 = (char *)0x0;
    pcVar6 = pcVar4;
    while( true ) {
      for (; cVar1 = *pcVar6, cVar1 == '\\'; pcVar6 = pcVar6 + 2) {
        if ((pcVar6[1] != '\\') && (pcVar6[1] != '\"')) goto LAB_0010e40d;
        if (pcVar3 == (char *)0x0) {
          pcVar3 = pcVar6;
        }
      }
      if (cVar1 == '\0') goto LAB_0010e479;
      if (cVar1 == '\"') break;
LAB_0010e40d:
      pcVar6 = pcVar6 + 1;
    }
    *end_pos = pcVar6;
    pcVar5 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      do {
        if ((*pcVar5 == '\\') && ((pcVar5[1] == '\\' || (pcVar5[1] == '\"')))) {
          pcVar5 = pcVar5 + 1;
        }
        pcVar6 = pcVar5 + 1;
        *pcVar3 = *pcVar5;
        pcVar3 = pcVar3 + 1;
        pcVar5 = pcVar6;
      } while (pcVar6 < *end_pos);
      *end_pos = pcVar3;
    }
    for (; ((cVar1 = *pcVar6, cVar1 != '\0' && (cVar1 != ';')) && (cVar1 != endchar));
        pcVar6 = pcVar6 + 1) {
    }
  }
  else {
LAB_0010e479:
    while (((pcVar6 = pcVar2, cVar1 = *pcVar6, cVar1 != '\0' && (cVar1 != ';')) &&
           (cVar1 != endchar))) {
      pcVar2 = pcVar6 + 1;
    }
    *end_pos = pcVar6;
    pcVar4 = pcVar5;
  }
  *str = pcVar6;
  return pcVar4;
}

Assistant:

static char *get_param_word(char **str, char **end_pos, char endchar)
{
  char *ptr = *str;
  /* the first non-space char is here */
  char *word_begin = ptr;
  char *ptr2;
  char *escape = NULL;

  if(*ptr == '"') {
    ++ptr;
    while(*ptr) {
      if(*ptr == '\\') {
        if(ptr[1] == '\\' || ptr[1] == '"') {
          /* remember the first escape position */
          if(!escape)
            escape = ptr;
          /* skip escape of back-slash or double-quote */
          ptr += 2;
          continue;
        }
      }
      if(*ptr == '"') {
        *end_pos = ptr;
        if(escape) {
          /* has escape, we restore the unescaped string here */
          ptr = ptr2 = escape;
          do {
            if(*ptr == '\\' && (ptr[1] == '\\' || ptr[1] == '"'))
              ++ptr;
            *ptr2++ = *ptr++;
          }
          while(ptr < *end_pos);
          *end_pos = ptr2;
        }
        while(*ptr && *ptr != ';' && *ptr != endchar)
          ++ptr;
        *str = ptr;
        return word_begin + 1;
      }
      ++ptr;
    }
    /* end quote is missing, treat it as non-quoted. */
    ptr = word_begin;
  }

  while(*ptr && *ptr != ';' && *ptr != endchar)
    ++ptr;
  *str = *end_pos = ptr;
  return word_begin;
}